

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomizedRenderGrid::getOrigin
          (RandomizedRenderGrid *this)

{
  int iVar1;
  long in_RSI;
  Vector<int,_2> local_30;
  Vector<int,_2> local_28;
  int local_20;
  int local_1c;
  int gridY;
  int gridX;
  RandomizedRenderGrid *this_local;
  IVec2 *currentOrigin;
  
  iVar1 = *(int *)(in_RSI + 0x18);
  this_local = this;
  local_1c = tcu::Vector<int,_2>::x((Vector<int,_2> *)(in_RSI + 0x10));
  local_1c = (iVar1 + -1) % local_1c;
  iVar1 = *(int *)(in_RSI + 0x18);
  local_20 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(in_RSI + 0x10));
  local_20 = (iVar1 + -1) / local_20;
  tcu::Vector<int,_2>::Vector(&local_30,local_1c,local_20);
  tcu::operator*((tcu *)&local_28,&local_30,(Vector<int,_2> *)(in_RSI + 8));
  tcu::operator+((tcu *)this,&local_28,(Vector<int,_2> *)(in_RSI + 0x20));
  return (IVec2)(int  [2])this;
}

Assistant:

IVec2 RandomizedRenderGrid::getOrigin (void) const
{
	const int	gridX		  = (m_currentCell - 1) % m_grid.x();
	const int	gridY		  = (m_currentCell - 1) / m_grid.x();
	const IVec2 currentOrigin = (IVec2(gridX, gridY) * m_cellSize) + m_baseRandomOffset;

	DE_ASSERT(currentOrigin.x() >= 0 && (currentOrigin.x() + m_cellSize.x()) <= m_targetSize.x());
	DE_ASSERT(currentOrigin.y() >= 0 && (currentOrigin.y() + m_cellSize.y()) <= m_targetSize.y());

	return currentOrigin;
}